

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_graphics.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 uStack_8;
  
  init_demo_menu((DEMO_MENU *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(int)((ulong)in_RAX >> 0x20))
  ;
  uStack_8 = (int)in_RAX;
  disable_continue_game();
  play_music(unaff_retaddr_00,unaff_retaddr);
  return uStack_8;
}

Assistant:

static void init(void)
{
   if (!choice_res) {
      int i, n = al_get_num_display_modes(), j = 0;
      choice_res = calloc(n + 1, sizeof *choice_res);
      menu[3].data = (void *)choice_res;
      for (i = 0; i < n; i++) {
         ALLEGRO_DISPLAY_MODE m;
         char str[100];
         al_get_display_mode(i, &m);
         sprintf(str, "%dx%d", m.width, m.height);
         if (!already(str)) {
            if (m.width == screen_width && m.height == screen_height) {
               menu[3].extra = j;
            }
            choice_res[j++] = strdup(str);
         }
      }
   }
   
   init_demo_menu(menu, true);

   menu[1].extra = fullscreen;

   menu[5].extra = use_vsync;
   
   on_fullscreen(menu + 1);
}